

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bf_crc.cc
# Opt level: O0

string * __thiscall bf_crc::show_reflect_output_abi_cxx11_(bf_crc *this)

{
  allocator<char> *in_RSI;
  string *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unaff_retaddr;
  allocator<char> local_11;
  string *__s;
  
  __s = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(unaff_retaddr,(char *)__s,in_RSI);
  std::allocator<char>::~allocator(&local_11);
  return in_RDI;
}

Assistant:

std::string bf_crc::show_reflect_output (void) {
    return 	"uint32_t reflect_output(uint32_t  x ) {\n"
        "  uint32_t reflection = 0;\n"
        "  uint32_t const  one = 1;\n"
        "  uint32_t width_ = 16;\n"
        "  for( uint32_t i = 0 ; i < width_ ; ++i, x >>= 1 ) {\n"
        "    if ( x & one )\n"
        "      reflection |= ( one << (width_ - 1u - i) );\n"
        "  }\n"
        "  return reflection;\n"
        "}\n";
}